

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::ImageSamplingInstance::verifyImage
          (TestStatus *__return_storage_ptr__,ImageSamplingInstance *this)

{
  RasterizationState *this_00;
  float fVar1;
  TestTexture *pTVar2;
  TestLog *pTVar3;
  TestStatus *pTVar4;
  bool bVar5;
  int i;
  int iVar6;
  deUint32 queueFamilyIndex;
  VkPhysicalDeviceProperties *pVVar7;
  long lVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *allocator;
  undefined7 extraout_var;
  int i_2;
  ConstPixelBufferAccess *pCVar9;
  void *__buf;
  void *__buf_00;
  byte bVar10;
  ulong uVar11;
  bool bVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  long local_5b8;
  Vec2 lodBounds;
  string local_5a8;
  ulong local_588;
  VkComponentMapping *local_580;
  string local_578;
  string local_558;
  Vec4 lookupScale;
  VkImageSubresourceRange subresource;
  string local_508;
  TestStatus *local_4e8;
  UVec2 *local_4e0;
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  LookupPrecision local_4c4;
  Vec4 lookupBias;
  ConstPixelBufferAccess coordAccess;
  RenderState renderState;
  ConstPixelBufferAccess resultAccess;
  LookupPrecision relaxedPrecision;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [6];
  CoordinateCaptureProgram coordCaptureProgram;
  TextureFormat depthStencilFormat;
  TextureFormat colorFormat;
  TextureLevel errorMask;
  PixelBufferAccess errorAccess;
  Sampler sampler;
  Program rrProgram;
  ReferenceRenderer refRenderer;
  
  local_4e8 = __return_storage_ptr__;
  pVVar7 = Context::getDeviceProperties((this->super_TestInstance).m_context);
  colorFormat.order = RGBA;
  colorFormat.type = FLOAT;
  depthStencilFormat.order = CHANNELORDER_LAST;
  depthStencilFormat.type = CHANNELTYPE_LAST;
  CoordinateCaptureProgram::CoordinateCaptureProgram(&coordCaptureProgram);
  rrProgram.vertexShader = &coordCaptureProgram.m_vertexShader.super_VertexShader;
  rrProgram.fragmentShader = &coordCaptureProgram.m_fragmentShader.super_FragmentShader;
  rrProgram.geometryShader = (GeometryShader *)0x0;
  ReferenceRenderer::ReferenceRenderer
            (&refRenderer,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,
             &colorFormat,&depthStencilFormat,&rrProgram);
  local_4e0 = &this->m_renderSize;
  lVar8 = 0;
  do {
    lookupScale.m_data[lVar8] = 1.0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  lookupBias.m_data[0] = 0.0;
  lookupBias.m_data[1] = 0.0;
  lookupBias.m_data[2] = 0.0;
  lookupBias.m_data[3] = 0.0;
  getLookupScaleBias(this->m_imageFormat,&lookupScale,&lookupBias);
  ReferenceRenderer::getViewportState(&refRenderer);
  renderState.cullMode = CULLMODE_NONE;
  renderState.provokingVertexConvention = PROVOKINGVERTEX_LAST;
  renderState.rasterization.winding = WINDING_CCW;
  renderState.rasterization.horizontalFill = FILL_LEFT;
  renderState.rasterization.verticalFill = FILL_BOTTOM;
  renderState.rasterization.viewportOrientation = VIEWPORTORIENTATION_LAST;
  rr::FragmentOperationState::FragmentOperationState(&renderState.fragOps);
  renderState.point.pointSize = 1.0;
  renderState.viewport.rect.left = relaxedPrecision.coordBits.m_data[0];
  renderState.viewport.rect.bottom = relaxedPrecision.coordBits.m_data[1];
  renderState.viewport.rect.width = relaxedPrecision.coordBits.m_data[2];
  renderState.viewport.rect.height = relaxedPrecision.uvwBits.m_data[0];
  renderState.viewport.zn = (float)relaxedPrecision.uvwBits.m_data[1];
  renderState.viewport.zf = (float)relaxedPrecision.uvwBits.m_data[2];
  renderState.line.lineWidth = 1.0;
  renderState.restart.enabled = false;
  renderState.restart.restartIndex = 0xffffffff;
  renderState.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
  renderState.rasterization.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
  ReferenceRenderer::draw(&refRenderer,&renderState,PRIMITIVETYPE_TRIANGLES,&this->m_vertices);
  ::vk::mapVkSampler(&sampler,&this->m_samplerParams);
  fVar14 = (this->m_samplerParams).mipLodBias + this->m_samplerLod;
  fVar1 = (this->m_samplerParams).minLod;
  fVar15 = (this->m_samplerParams).maxLod;
  if (fVar14 <= fVar15) {
    fVar15 = fVar14;
  }
  uVar13 = -(uint)(fVar14 < fVar1);
  fVar1 = (float)(uVar13 & (uint)fVar1 | ~uVar13 & (uint)fVar15);
  fVar15 = 1.0 / (float)~(-1 << ((byte)(pVVar7->limits).mipmapPrecisionBits & 0x1f));
  lodBounds.m_data[0] = fVar1 - fVar15;
  lodBounds.m_data[1] = fVar15 + fVar1;
  pTVar2 = (this->m_texture).
           super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
           .m_data.ptr;
  subresource.layerCount = (this->m_subresourceRange).layerCount;
  subresource.aspectMask = (this->m_subresourceRange).aspectMask;
  subresource.baseMipLevel = (this->m_subresourceRange).baseMipLevel;
  subresource.levelCount = (this->m_subresourceRange).levelCount;
  subresource.baseArrayLayer = (this->m_subresourceRange).baseArrayLayer;
  if ((this->m_subresourceRange).levelCount == 0xffffffff) {
    iVar6 = (*pTVar2->_vptr_TestTexture[2])(pTVar2);
    subresource.levelCount = iVar6 - (this->m_subresourceRange).baseMipLevel;
  }
  if ((this->m_subresourceRange).layerCount == 0xffffffff) {
    iVar6 = (*pTVar2->_vptr_TestTexture[4])(pTVar2);
    subresource.layerCount = iVar6 - (this->m_subresourceRange).baseArrayLayer;
  }
  ReferenceRenderer::getAccess((PixelBufferAccess *)&renderState,&refRenderer);
  coordAccess.m_size.m_data[1] = renderState.rasterization.horizontalFill;
  coordAccess.m_size.m_data[0] = renderState.rasterization.winding;
  coordAccess.m_format.order = renderState.cullMode;
  coordAccess.m_format.type = renderState.provokingVertexConvention;
  coordAccess.m_size.m_data[2] = renderState.rasterization.verticalFill;
  coordAccess.m_pitch.m_data[1] = renderState.fragOps._0_4_;
  coordAccess.m_pitch.m_data[0] = renderState.rasterization.viewportOrientation;
  coordAccess.m_pitch.m_data[2] = renderState.fragOps.scissorRectangle.left;
  coordAccess.m_data = (void *)renderState.fragOps.scissorRectangle._4_8_;
  renderState.cullMode = 8;
  renderState.provokingVertexConvention = 3;
  tcu::TextureLevel::TextureLevel
            (&errorMask,(TextureFormat *)&renderState,(this->m_renderSize).m_data[0],
             (this->m_renderSize).m_data[1],1);
  tcu::TextureLevel::getAccess(&errorAccess,&errorMask);
  iVar6 = (*((this->m_texture).
             super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
             .m_data.ptr)->_vptr_TestTexture[0xe])();
  bVar12 = true;
  if (*(int *)(CONCAT44(extraout_var_00,iVar6) + 4) == 0) {
    if ((this->m_samplerParams).minFilter == VK_FILTER_LINEAR) {
      bVar12 = false;
    }
    else {
      bVar12 = (this->m_samplerParams).magFilter != VK_FILTER_LINEAR;
    }
  }
  lVar8 = 0;
  do {
    local_4c4.coordBits.m_data[lVar8] = 0x16;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 3;
  do {
    local_4c4.coordBits.m_data[lVar8] = 0x10;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  local_4c4.colorThreshold.m_data[0] = 0.0;
  local_4c4.colorThreshold.m_data[1] = 0.0;
  local_4c4.colorThreshold.m_data[2] = 0.0;
  local_4c4.colorThreshold.m_data[3] = 0.0;
  local_4c4.colorMask.m_data[0] = true;
  local_4c4.colorMask.m_data[1] = true;
  local_4c4.colorMask.m_data[2] = true;
  local_4c4.colorMask.m_data[3] = true;
  local_4c4.coordBits.m_data[0] = 0x11;
  local_4c4.coordBits.m_data[1] = 0x11;
  local_4c4.coordBits.m_data[2] = 0x11;
  local_4c4.uvwBits.m_data[0] = 5;
  local_4c4.uvwBits.m_data[1] = 5;
  local_4c4.uvwBits.m_data[2] = 5;
  local_578._M_dataplus._M_p = (pointer)0x800000008;
  local_578._M_string_length = 0x800000008;
  tcu::computeFixedPointThreshold((tcu *)&resultAccess,(IVec4 *)&local_578);
  local_580 = &this->m_componentMapping;
  renderState.cullMode = 0x3f800000;
  renderState.provokingVertexConvention = 0x3f800000;
  renderState.rasterization.winding = 0x3f800000;
  renderState.rasterization.horizontalFill = lookupScale.m_data[0];
  renderState.rasterization.verticalFill = lookupScale.m_data[1];
  renderState.rasterization.viewportOrientation = lookupScale.m_data[2];
  renderState.fragOps._0_4_ = lookupScale.m_data[3];
  local_5a8._M_dataplus._M_p._4_4_ =
       *(undefined4 *)
        ((long)renderState.fragOps.stencilStates + (ulong)(this->m_componentMapping).g * 4 + -0x30);
  local_5a8._M_dataplus._M_p._0_4_ =
       *(undefined4 *)
        ((long)renderState.fragOps.stencilStates + (ulong)(this->m_componentMapping).r * 4 + -0x30);
  local_5a8._M_string_length._0_4_ =
       *(undefined4 *)
        ((long)renderState.fragOps.stencilStates + (ulong)(this->m_componentMapping).b * 4 + -0x30);
  local_5a8._M_string_length._4_4_ =
       *(undefined4 *)
        ((long)renderState.fragOps.stencilStates + (ulong)(this->m_componentMapping).a * 4 + -0x30);
  relaxedPrecision.coordBits.m_data[0] = 0;
  relaxedPrecision.coordBits.m_data[1] = 0;
  relaxedPrecision.coordBits.m_data[2] = 0;
  relaxedPrecision.uvwBits.m_data[0] = 0;
  lVar8 = 0;
  do {
    relaxedPrecision.coordBits.m_data[lVar8] =
         (int)((float)resultAccess.m_size.m_data[lVar8 + -2] /
              *(float *)((long)&local_5a8._M_dataplus._M_p + lVar8 * 4));
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  local_4c4.colorThreshold.m_data[0] = (float)relaxedPrecision.coordBits.m_data[0];
  local_4c4.colorThreshold.m_data[1] = (float)relaxedPrecision.coordBits.m_data[1];
  local_4c4.colorThreshold.m_data[2] = (float)relaxedPrecision.coordBits.m_data[2];
  local_4c4.colorThreshold.m_data[3] = (float)relaxedPrecision.uvwBits.m_data[0];
  iVar6 = (*((this->m_texture).
             super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
             .m_data.ptr)->_vptr_TestTexture[0xe])();
  bVar5 = tcu::isSRGB(*(TextureFormat *)CONCAT44(extraout_var_01,iVar6));
  if (bVar5) {
    lVar8 = 0;
    do {
      *(undefined4 *)((long)renderState.fragOps.stencilStates + lVar8 * 4 + -0x30) = 0x3c808081;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar8 = 0;
    do {
      local_4c4.colorThreshold.m_data[lVar8] =
           *(float *)((long)renderState.fragOps.stencilStates + lVar8 * 4 + -0x30) +
           local_4c4.colorThreshold.m_data[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
  }
  if (this->m_imageCount < 1) {
    bVar10 = 1;
    uVar11 = 0;
  }
  else {
    bVar10 = 1;
    local_5b8 = 0;
    local_588 = 0;
    do {
      vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
      device = Context::getDevice((this->super_TestInstance).m_context);
      queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
      queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context)
      ;
      allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
      readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                          &renderState,vk,device,queue,queueFamilyIndex,allocator,
                          (VkImage)*(deUint64 *)
                                    &(((this->m_colorImages).
                                       super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[local_5b8].m_ptr)->
                                     super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data,
                          this->m_colorFormat,local_4e0);
      result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr
           = (TextureLevel *)renderState._0_8_;
      renderState.cullMode = CULLMODE_NONE;
      renderState.provokingVertexConvention = PROVOKINGVERTEX_FIRST;
      de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
                ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                 &renderState);
      tcu::TextureLevel::getAccess
                ((PixelBufferAccess *)&renderState,
                 result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                 m_data.ptr);
      pCVar9 = &resultAccess;
      resultAccess.m_format.order = renderState.cullMode;
      resultAccess.m_format.type = renderState.provokingVertexConvention;
      resultAccess.m_size.m_data[2] = renderState.rasterization.verticalFill;
      resultAccess.m_size.m_data[1] = renderState.rasterization.horizontalFill;
      resultAccess.m_size.m_data[0] = renderState.rasterization.winding;
      resultAccess.m_pitch.m_data[2] = renderState.fragOps.scissorRectangle.left;
      resultAccess.m_pitch.m_data[1] = renderState.fragOps._0_4_;
      resultAccess.m_pitch.m_data[0] = renderState.rasterization.viewportOrientation;
      resultAccess.m_data = (void *)renderState.fragOps.scissorRectangle._4_8_;
      bVar5 = pipeline::anon_unknown_0::validateResultImage
                        ((this->m_texture).
                         super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                         .m_data.ptr,this->m_imageViewType,&subresource,&sampler,local_580,
                         &coordAccess,&lodBounds,&local_4c4,&lookupScale,&lookupBias,pCVar9,
                         &errorAccess);
      if (!bVar5 && !bVar12) {
        lVar8 = 0;
        do {
          relaxedPrecision.coordBits.m_data[lVar8] = 0x16;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lVar8 = 3;
        this_00 = &renderState.rasterization;
        do {
          relaxedPrecision.coordBits.m_data[lVar8] = 0x10;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 6);
        relaxedPrecision.colorThreshold.m_data[0] = 0.0;
        relaxedPrecision.colorThreshold.m_data[1] = 0.0;
        relaxedPrecision.colorThreshold.m_data[2] = 0.0;
        relaxedPrecision.colorThreshold.m_data[3] = 0.0;
        relaxedPrecision.colorMask.m_data[0] = true;
        relaxedPrecision.colorMask.m_data[1] = true;
        relaxedPrecision.colorMask.m_data[2] = true;
        relaxedPrecision.colorMask.m_data[3] = true;
        lVar8 = 0;
        do {
          *(undefined4 *)((long)renderState.fragOps.stencilStates + lVar8 * 4 + -0x30) = 0x3c808081;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        lVar8 = 6;
        do {
          relaxedPrecision.coordBits.m_data[lVar8] =
               (int)((float)coordAccess.m_size.m_data[lVar8 + 2] +
                    (float)relaxedPrecision.coordBits.m_data[lVar8]);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 10);
        renderState._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "Warning: Strict validation failed, re-trying with lower precision for SNORM8 format"
                   ,0x53);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&renderState,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
        std::ios_base::~ios_base((ios_base *)&renderState.fragOps.blendRGBState);
        bVar5 = pipeline::anon_unknown_0::validateResultImage
                          ((this->m_texture).
                           super_UniqueBase<vkt::pipeline::TestTexture,_de::DefaultDeleter<vkt::pipeline::TestTexture>_>
                           .m_data.ptr,this->m_imageViewType,&subresource,&sampler,local_580,
                           &coordAccess,&lodBounds,&relaxedPrecision,&lookupScale,&lookupBias,pCVar9
                           ,&errorAccess);
        local_588 = CONCAT71(extraout_var,1);
      }
      if (bVar5 == false) {
        pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
        local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"Result","");
        local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"Result Image","");
        tcu::LogImage::LogImage
                  ((LogImage *)&renderState,&local_578,&local_5a8,pCVar9,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar6 = (int)pTVar3;
        tcu::LogImage::write((LogImage *)&renderState,iVar6,__buf,(size_t)pCVar9);
        local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"ErrorMask","");
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"Error Mask","");
        pCVar9 = &errorAccess.super_ConstPixelBufferAccess;
        tcu::LogImage::LogImage
                  ((LogImage *)&relaxedPrecision,&local_558,&local_508,pCVar9,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&relaxedPrecision,iVar6,__buf_00,(size_t)pCVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)relaxedPrecision.colorThreshold.m_data._8_8_ != local_278) {
          operator_delete((void *)relaxedPrecision.colorThreshold.m_data._8_8_,
                          local_278[0]._M_allocated_capacity + 1);
        }
        if ((int *)relaxedPrecision.coordBits.m_data._0_8_ != relaxedPrecision.uvwBits.m_data + 1) {
          operator_delete((void *)relaxedPrecision.coordBits.m_data._0_8_,
                          relaxedPrecision.uvwBits.m_data._4_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != &local_558.field_2) {
          operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
        }
        if ((StencilState *)renderState.fragOps.scissorRectangle._4_8_ !=
            renderState.fragOps.stencilStates) {
          operator_delete((void *)renderState.fragOps.scissorRectangle._4_8_,
                          renderState.fragOps.stencilStates[0]._0_8_ + 1);
        }
        if ((VerticalFill *)renderState._0_8_ != &renderState.rasterization.verticalFill) {
          operator_delete((void *)renderState._0_8_,
                          CONCAT44(renderState.rasterization.viewportOrientation,
                                   renderState.rasterization.verticalFill) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
          operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
      }
      de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
                (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>
                );
      bVar10 = bVar10 & bVar5;
      local_5b8 = local_5b8 + 1;
      uVar11 = local_588;
    } while (local_5b8 < this->m_imageCount);
  }
  tcu::TextureLevel::~TextureLevel(&errorMask);
  pTVar4 = local_4e8;
  if (bVar10 == 0) {
    renderState._0_8_ = &renderState.rasterization.verticalFill;
    std::__cxx11::string::_M_construct<char_const*>((string *)&renderState,"Image mismatch","");
    pTVar4->m_code = QP_TEST_RESULT_FAIL;
    (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar4->m_description,renderState._0_8_,
               CONCAT44(renderState.rasterization.horizontalFill,renderState.rasterization.winding)
               + renderState._0_8_);
  }
  else if ((uVar11 & 1) == 0) {
    renderState._0_8_ = &renderState.rasterization.verticalFill;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&renderState,"Result image matches reference","");
    pTVar4->m_code = QP_TEST_RESULT_PASS;
    (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar4->m_description,renderState._0_8_,
               CONCAT44(renderState.rasterization.horizontalFill,renderState.rasterization.winding)
               + renderState._0_8_);
  }
  else {
    renderState._0_8_ = &renderState.rasterization.verticalFill;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&renderState,"Inaccurate filtering results","");
    pTVar4->m_code = QP_TEST_RESULT_QUALITY_WARNING;
    (pTVar4->m_description)._M_dataplus._M_p = (pointer)&(pTVar4->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar4->m_description,renderState._0_8_,
               CONCAT44(renderState.rasterization.horizontalFill,renderState.rasterization.winding)
               + renderState._0_8_);
  }
  if ((VerticalFill *)renderState._0_8_ != &renderState.rasterization.verticalFill) {
    operator_delete((void *)renderState._0_8_,
                    CONCAT44(renderState.rasterization.viewportOrientation,
                             renderState.rasterization.verticalFill) + 1);
  }
  ReferenceRenderer::~ReferenceRenderer(&refRenderer);
  coordCaptureProgram.super_Program._vptr_Program =
       (_func_int **)&PTR__CoordinateCaptureProgram_00d237a8;
  rr::FragmentShader::~FragmentShader(&coordCaptureProgram.m_fragmentShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&coordCaptureProgram.m_vertexShader.super_VertexShader);
  return pTVar4;
}

Assistant:

tcu::TestStatus ImageSamplingInstance::verifyImage (void)
{
	const VkPhysicalDeviceLimits&		limits					= m_context.getDeviceProperties().limits;
	// \note Color buffer is used to capture coordinates - not sampled texture values
	const tcu::TextureFormat			colorFormat				(tcu::TextureFormat::RGBA, tcu::TextureFormat::FLOAT);
	const tcu::TextureFormat			depthStencilFormat;		// Undefined depth/stencil format.
	const CoordinateCaptureProgram		coordCaptureProgram;
	const rr::Program					rrProgram				= coordCaptureProgram.getReferenceProgram();
	ReferenceRenderer					refRenderer				(m_renderSize.x(), m_renderSize.y(), 1, colorFormat, depthStencilFormat, &rrProgram);

	bool								compareOkAll			= true;
	bool								anyWarnings				= false;

	tcu::Vec4							lookupScale				(1.0f);
	tcu::Vec4							lookupBias				(0.0f);

	getLookupScaleBias(m_imageFormat, lookupScale, lookupBias);

	// Render out coordinates
	{
		const rr::RenderState renderState(refRenderer.getViewportState());
		refRenderer.draw(renderState, rr::PRIMITIVETYPE_TRIANGLES, m_vertices);
	}

	// Verify results
	{
		const tcu::Sampler					sampler			= mapVkSampler(m_samplerParams);
		const float							referenceLod	= de::clamp(m_samplerParams.mipLodBias + m_samplerLod, m_samplerParams.minLod, m_samplerParams.maxLod);
		const float							lodError		= 1.0f / static_cast<float>((1u << limits.mipmapPrecisionBits) - 1u);
		const tcu::Vec2						lodBounds		(referenceLod - lodError, referenceLod + lodError);
		const vk::VkImageSubresourceRange	subresource		= resolveSubresourceRange(*m_texture, m_subresourceRange);

		const tcu::ConstPixelBufferAccess	coordAccess		= refRenderer.getAccess();
		tcu::TextureLevel					errorMask		(tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8), (int)m_renderSize.x(), (int)m_renderSize.y());
		const tcu::PixelBufferAccess		errorAccess		= errorMask.getAccess();

		const bool							allowSnorm8Bug	= m_texture->getTextureFormat().type == tcu::TextureFormat::SNORM_INT8 &&
															  (m_samplerParams.minFilter == VK_FILTER_LINEAR || m_samplerParams.magFilter == VK_FILTER_LINEAR);

		tcu::LookupPrecision				lookupPrecision;

		// Set precision requirements - very low for these tests as
		// the point of the test is not to validate accuracy.
		lookupPrecision.coordBits		= tcu::IVec3(17, 17, 17);
		lookupPrecision.uvwBits			= tcu::IVec3(5, 5, 5);
		lookupPrecision.colorMask		= tcu::BVec4(true);
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(tcu::IVec4(8, 8, 8, 8)) / swizzleScaleBias(lookupScale, m_componentMapping);

		if (tcu::isSRGB(m_texture->getTextureFormat()))
			lookupPrecision.colorThreshold += tcu::Vec4(4.f / 255.f);

		for (int imgNdx = 0; imgNdx < m_imageCount; ++imgNdx)
		{
			// Read back result image
			UniquePtr<tcu::TextureLevel>		result			(readColorAttachment(m_context.getDeviceInterface(),
																					 m_context.getDevice(),
																					 m_context.getUniversalQueue(),
																					 m_context.getUniversalQueueFamilyIndex(),
																					 m_context.getDefaultAllocator(),
																					 **m_colorImages[imgNdx],
																					 m_colorFormat,
																					 m_renderSize));
			const tcu::ConstPixelBufferAccess	resultAccess	= result->getAccess();
			bool								compareOk		= validateResultImage(*m_texture,
																					  m_imageViewType,
																					  subresource,
																					  sampler,
																					  m_componentMapping,
																					  coordAccess,
																					  lodBounds,
																					  lookupPrecision,
																					  lookupScale,
																					  lookupBias,
																					  resultAccess,
																					  errorAccess);

			if (!compareOk && allowSnorm8Bug)
			{
				// HW waiver (VK-GL-CTS issue: 229)
				//
				// Due to an error in bit replication of the fixed point SNORM values, linear filtered
				// negative SNORM values will differ slightly from ideal precision in the last bit, moving
				// the values towards 0.
				//
				// This occurs on all members of the PowerVR Rogue family of GPUs
				tcu::LookupPrecision	relaxedPrecision;

				relaxedPrecision.colorThreshold += tcu::Vec4(4.f / 255.f);

				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Warning: Strict validation failed, re-trying with lower precision for SNORM8 format"
					<< tcu::TestLog::EndMessage;
				anyWarnings = true;

				compareOk = validateResultImage(*m_texture,
												m_imageViewType,
												subresource,
												sampler,
												m_componentMapping,
												coordAccess,
												lodBounds,
												relaxedPrecision,
												lookupScale,
												lookupBias,
												resultAccess,
												errorAccess);
			}

			if (!compareOk)
				m_context.getTestContext().getLog()
				<< tcu::TestLog::Image("Result", "Result Image", resultAccess)
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorAccess);

			compareOkAll = compareOkAll && compareOk;
		}
	}

	if (compareOkAll)
	{
		if (anyWarnings)
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Inaccurate filtering results");
		else
			return tcu::TestStatus::pass("Result image matches reference");
	}
	else
		return tcu::TestStatus::fail("Image mismatch");
}